

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O1

int __thiscall HttpConn::close(HttpConn *this,int __fd)

{
  int *piVar1;
  EventLoop *this_00;
  WebServer *this_01;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  __shared_ptr<HttpConn,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  ChannelPtr local_30;
  
  this->connStatus_ = Disconnected;
  this_00 = this->loop_;
  local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  EventLoop::removeChannel(this_00,&local_30);
  if (local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  Channel::clearAll((this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  ::close(this->fd_);
  this->parseState_ = CheckRequestLine;
  this->read_idx_ = 0;
  this->checked_idx_ = 0;
  this->write_idx_ = 0;
  this->send_idx_ = 0;
  this->readable_ = true;
  this->writeable_ = false;
  ((this->channel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_ =
       -0x7ffffffb;
  EventLoop::clearTimer(this->loop_,this->id_);
  piVar1 = &this->loop_->connCnt_;
  *piVar1 = *piVar1 + -1;
  this->linger_ = false;
  this->fd_ = -1;
  this_01 = this->server_;
  std::__shared_ptr<HttpConn,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HttpConn,void>
            (local_40,(__weak_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2> *)this);
  WebServer::returnConn(this_01,(HttpConnPtr *)local_40);
  iVar2 = extraout_EAX;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void HttpConn::close() {
    connStatus_ = Disconnected;
    loop_->removeChannel(channel_);
    channel_->clearAll();
    ::close(fd_); 
    reset();
    loop_->clearTimer(id_);
    loop_->minusConnCnt();
    linger_ = false;
    fd_ = -1;
    server_->returnConn(shared_from_this());
}